

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_stepping_padding.cpp
# Opt level: O2

void test_2d_dynamic<1ul,5ul,1ul,0ul,30ul,30ul>(void)

{
  size_type sVar1;
  reference pvVar2;
  int *piVar3;
  int *piVar4;
  ulong uVar5;
  long lVar6;
  int *local_80;
  value_type true_idx;
  int *local_70;
  int *local_68;
  int *local_60;
  int *local_58;
  int *local_50;
  vector<int,_std::allocator<int>_> data;
  
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,1);
  true_idx = CONCAT71(true_idx._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0xaf,
             "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
             ,(bool *)&data,(bool *)&true_idx);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  true_idx = CONCAT44(true_idx._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0xb1,
             "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&data,(int *)&true_idx);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  true_idx = CONCAT44(true_idx._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0xb2,
             "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&data,(int *)&true_idx);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x384;
  true_idx = 900;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0xb4,
             "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&data,&true_idx);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&DAT_000003a2;
  true_idx = 0x3a2;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","(X + PadX) * (Y + PadY)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0xb5,
             "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&data,&true_idx);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,1);
  true_idx = CONCAT71(true_idx._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(sub_l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0xbd,
             "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
             ,(bool *)&data,(bool *)&true_idx);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  true_idx = 1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(0))","StepX",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0xbf,
             "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&data,&true_idx);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x5;
  true_idx = 5;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(1))","StepY",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0xc0,
             "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&data,&true_idx);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0xb4;
  true_idx = 0xb4;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.size())","(X / StepX) * (Y / StepY)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0xc2,
             "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&data,&true_idx);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&DAT_000003a2;
  true_idx = 0x3a2;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.span())","(X + PadX) * (Y + PadY)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0xc3,
             "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&data,&true_idx);
  true_idx = CONCAT44(true_idx._4_4_,0x2a);
  std::vector<int,_std::allocator<int>_>::vector
            (&data,0x3a2,(value_type_conflict1 *)&true_idx,(allocator_type *)&local_80);
  local_58 = data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
  piVar4 = (int *)0x0;
  local_70 = data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
  while (piVar4 != (int *)0x1e) {
    local_68 = local_70;
    local_60 = piVar4;
    for (lVar6 = 0; lVar6 != 0x3a2; lVar6 = lVar6 + 0x1e) {
      sVar1 = (long)local_60 + lVar6;
      local_80 = (int *)sVar1;
      true_idx = sVar1;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0xd1,
                 "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                 ,(unsigned_long *)&local_80,&true_idx);
      local_80 = local_70;
      local_50 = local_58 + true_idx;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0xd3,
                 "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                 ,&local_80,&local_50);
      if (lVar6 == 900) {
        *local_70 = 0x11;
        local_80._0_4_ = 0x11;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","17",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                   ,0xda,
                   "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                   ,local_70,(int *)&local_80);
        pvVar2 = std::vector<int,_std::allocator<int>_>::at(&data,sVar1);
        local_80 = (int *)CONCAT44(local_80._4_4_,0x11);
        boost::detail::test_eq_impl<int,int>
                  ("(data.at(l.index(i, j)))","17",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                   ,0xdd,
                   "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                   ,pvVar2,(int *)&local_80);
      }
      local_70 = local_70 + 0x1e;
    }
    local_70 = local_68 + 1;
    piVar4 = (int *)((long)local_60 + 1);
  }
  local_70 = (int *)0x0;
  piVar3 = (int *)0x0;
  piVar4 = local_58;
  while (piVar3 != (int *)0x6) {
    local_68 = piVar3;
    local_60 = piVar4;
    for (lVar6 = 0; lVar6 != 900; lVar6 = lVar6 + 0x1e) {
      sVar1 = (long)local_70 + lVar6;
      local_80 = (int *)sVar1;
      true_idx = sVar1;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(sub_l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0xf4,
                 "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                 ,(unsigned_long *)&local_80,&true_idx);
      local_50 = local_58 + true_idx;
      local_80 = piVar4;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[sub_l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0xf6,
                 "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                 ,&local_80,&local_50);
      *piVar4 = 0x47;
      local_80._0_4_ = 0x47;
      boost::detail::test_eq_impl<int,int>
                ("(dptr[sub_l.index(i, j)])","71",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0xfa,
                 "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                 ,piVar4,(int *)&local_80);
      pvVar2 = std::vector<int,_std::allocator<int>_>::at(&data,sVar1);
      local_80 = (int *)CONCAT44(local_80._4_4_,0x47);
      boost::detail::test_eq_impl<int,int>
                ("(data.at(sub_l.index(i, j)))","71",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0xfd,
                 "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                 ,pvVar2,(int *)&local_80);
      piVar4 = piVar4 + 0x1e;
    }
    local_70 = (int *)((long)local_70 + 5);
    piVar4 = local_60 + 5;
    piVar3 = (int *)((long)local_68 + 1);
  }
  uVar5 = 0;
  piVar4 = local_58;
  while (uVar5 != 0x1e) {
    local_60 = (int *)CONCAT44(local_60._4_4_,(int)((uVar5 & 0xffffffff) % 5));
    local_70 = (int *)uVar5;
    local_68 = piVar4;
    for (lVar6 = 0; lVar6 != 0x3a2; lVar6 = lVar6 + 0x1e) {
      sVar1 = (long)local_70 + lVar6;
      local_80 = (int *)sVar1;
      true_idx = sVar1;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0x106,
                 "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                 ,(unsigned_long *)&local_80,&true_idx);
      local_50 = local_58 + true_idx;
      local_80 = piVar4;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0x108,
                 "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                 ,&local_80,&local_50);
      if (lVar6 == 900) {
        local_80._0_4_ = 0x11;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","17",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                   ,0x10d,
                   "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                   ,piVar4,(int *)&local_80);
        pvVar2 = std::vector<int,_std::allocator<int>_>::at(&data,sVar1);
        local_80 = (int *)CONCAT44(local_80._4_4_,0x11);
        boost::detail::test_eq_impl<int,int>
                  ("(data.at(l.index(i, j)))","17",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                   ,0x110,
                   "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                   ,pvVar2,(int *)&local_80);
      }
      else if ((int)local_60 == 0) {
        local_80._0_4_ = 0x47;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","71",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                   ,0x124,
                   "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                   ,piVar4,(int *)&local_80);
        pvVar2 = std::vector<int,_std::allocator<int>_>::at(&data,sVar1);
        local_80 = (int *)CONCAT44(local_80._4_4_,0x47);
        boost::detail::test_eq_impl<int,int>
                  ("(data.at(l.index(i, j)))","71",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                   ,0x127,
                   "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                   ,pvVar2,(int *)&local_80);
      }
      else {
        local_80._0_4_ = 0x2a;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","42",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                   ,300,
                   "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                   ,piVar4,(int *)&local_80);
        pvVar2 = std::vector<int,_std::allocator<int>_>::at(&data,sVar1);
        local_80 = (int *)CONCAT44(local_80._4_4_,0x2a);
        boost::detail::test_eq_impl<int,int>
                  ("(data.at(l.index(i, j)))","42",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                   ,0x12f,
                   "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                   ,pvVar2,(int *)&local_80);
      }
      piVar4 = piVar4 + 0x1e;
    }
    piVar4 = local_68 + 1;
    uVar5 = (long)local_70 + 1;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&data.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void test_2d_dynamic()
{ // {{{
    layout_mapping_right<
        dimensions<dyn, dyn>
      , dimensions<dyn, dyn>
      , dimensions<dyn, dyn>
    > const l{{X, Y}, {1, 1}, {PadX, PadY}};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), (X + PadX) * (Y + PadY));

    layout_mapping_right<
        dimensions<dyn, dyn>
      , dimensions<dyn, dyn>
      , dimensions<dyn, dyn>
    > const sub_l{{X / StepX, Y / StepY}, {StepX, StepY}, {PadX, PadY}};

    BOOST_TEST_EQ((sub_l.is_regular()), true);

    BOOST_TEST_EQ((sub_l.stride(0)), StepX);
    BOOST_TEST_EQ((sub_l.stride(1)), StepY);

    BOOST_TEST_EQ((sub_l.size()), (X / StepX) * (Y / StepY));
    BOOST_TEST_EQ((sub_l.span()), (X + PadX) * (Y + PadY));

    // Initialize all elements to 42.
    std::vector<int> data(
        (l[0] + l.padding()[0]) * (l[1] + l.padding()[1]), 42
    );
    int* dptr = data.data();

    // Set X pad elements to 17 and Y pad elements to 24. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            dptr[l.index(i, j)] = 17;
            
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            dptr[l.index(i, j)] = 24; 

            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 24);
        }
    }

    // Set every (StepXth, StepYth) element to 71.
    for (auto j = 0; j < sub_l[1]; ++j)
    for (auto i = 0; i < sub_l[0]; ++i)
    {
        auto const p = l.padding();
        auto const s = sub_l.stepping();
        auto const true_idx = (sub_l[1] * s[1] + p[1]) * (s[0] * i) + (s[1] * j);

        BOOST_TEST_EQ((sub_l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[sub_l.index(i, j)]), &(dptr[true_idx])); 

        dptr[sub_l.index(i, j)] = 71;

        BOOST_TEST_EQ((dptr[sub_l.index(i, j)]), 71);

        // Bounds-checking.
        BOOST_TEST_EQ((data.at(sub_l.index(i, j))), 71);
    }

    // Check final structure. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 24);
        }

        // Real element.
        else
        {
            // Real element in the strided sub-box.
            if (  (0 == (i % sub_l.stepping()[0]))
               && (0 == (j % sub_l.stepping()[1]))
               )
            {
                BOOST_TEST_EQ((dptr[l.index(i, j)]), 71);

                // Bounds-checking.
                BOOST_TEST_EQ((data.at(l.index(i, j))), 71);
            }
            // Real element not in the strided sub-box.
            else
            {
                BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);

                // Bounds-checking.
                BOOST_TEST_EQ((data.at(l.index(i, j))), 42);
            }
        }
    }
}